

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O0

bool __thiscall SampleMuxerMetadata::LoadChapters(SampleMuxerMetadata *this,char *file)

{
  bool bVar1;
  undefined1 local_38 [8];
  cue_list_t cues;
  char *file_local;
  SampleMuxerMetadata *this_local;
  
  cues.super__List_base<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>._M_impl._M_node._M_size =
       (size_t)file;
  bVar1 = std::__cxx11::list<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>::empty
                    (&this->chapter_cues_);
  if (bVar1) {
    std::__cxx11::list<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>::list
              ((list<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_> *)local_38);
    this_local._7_1_ =
         ParseChapters((char *)cues.
                               super__List_base<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>.
                               _M_impl._M_node._M_size,
                       (list<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_> *)local_38);
    if (this_local._7_1_) {
      std::__cxx11::list<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>::swap
                (&this->chapter_cues_,
                 (list<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_> *)local_38);
    }
    std::__cxx11::list<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>::~list
              ((list<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_> *)local_38);
  }
  else {
    printf("Support for more than one chapters file is not yet implemented\n");
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SampleMuxerMetadata::LoadChapters(const char* file) {
  if (!chapter_cues_.empty()) {
    printf("Support for more than one chapters file is not yet implemented\n");
    return false;
  }

  cue_list_t cues;

  if (!ParseChapters(file, &cues))
    return false;

  // TODO(matthewjheaney): support more than one chapters file
  chapter_cues_.swap(cues);

  return true;
}